

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsdCheck.c
# Opt level: O0

int Dsd_CheckRootFunctionIdentity_rec(DdManager *dd,DdNode *bF1,DdNode *bF2,DdNode *bC1,DdNode *bC2)

{
  DdNode *pDVar1;
  ulong uVar2;
  DdHalfWord local_13c;
  DdHalfWord local_12c;
  DdHalfWord local_11c;
  uint local_10c;
  DdNode *local_108;
  DdNode *bC2next;
  DdNode *bC1next;
  DdNode *bF2next;
  DdNode *bF1next;
  DdNode *bT [4];
  DdNode *bE [4];
  int local_a0;
  int local_9c;
  int i;
  int TopLevel;
  int CurLevel [4];
  DdNode *bAR [4];
  DdNode *bA [4];
  uint local_40;
  int RetValue;
  uint HKey;
  DdNode *bC2_local;
  DdNode *bC1_local;
  DdNode *bF2_local;
  DdNode *bF1_local;
  DdManager *dd_local;
  
  if (bC1 == (DdNode *)((ulong)dd->one ^ 1)) {
    __assert_fail("bC1 != b0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/dsd/dsdCheck.c"
                  ,0xa0,
                  "int Dsd_CheckRootFunctionIdentity_rec(DdManager *, DdNode *, DdNode *, DdNode *, DdNode *)"
                 );
  }
  if (bC2 == (DdNode *)((ulong)dd->one ^ 1)) {
    __assert_fail("bC2 != b0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/dsd/dsdCheck.c"
                  ,0xa1,
                  "int Dsd_CheckRootFunctionIdentity_rec(DdManager *, DdNode *, DdNode *, DdNode *, DdNode *)"
                 );
  }
  if ((bC1 == dd->one) && (bC2 == dd->one)) {
    dd_local._4_4_ = (uint)(bF1 == bF2);
  }
  else if (bF1 == (DdNode *)((ulong)dd->one ^ 1)) {
    dd_local._4_4_ = Cudd_bddLeq(dd,bC2,(DdNode *)((ulong)bF2 ^ 1));
  }
  else if (bF1 == dd->one) {
    dd_local._4_4_ = Cudd_bddLeq(dd,bC2,bF2);
  }
  else if (bF2 == (DdNode *)((ulong)dd->one ^ 1)) {
    dd_local._4_4_ = Cudd_bddLeq(dd,bC1,(DdNode *)((ulong)bF1 ^ 1));
  }
  else if (bF2 == dd->one) {
    dd_local._4_4_ = Cudd_bddLeq(dd,bC1,bF1);
  }
  else {
    uVar2 = (ulong)(((((long)&bF2->index + (long)&bF1->index) * 0xc00005 + (long)bC1) * 0x40f1f9 +
                    (long)bC2) * 0xb5051) % (ulong)(long)pCache->nTableSize;
    if ((((pCache->pTable[uVar2 & 0xffffffff].bX[0] == bF1) &&
         (pCache->pTable[uVar2 & 0xffffffff].bX[1] == bF2)) &&
        (pCache->pTable[uVar2 & 0xffffffff].bX[2] == bC1)) &&
       (pCache->pTable[uVar2 & 0xffffffff].bX[3] == bC2)) {
      pCache->nSuccess = pCache->nSuccess + 1;
      dd_local._4_4_ = (uint)pCache->pTable[uVar2 & 0xffffffff].bX[4];
    }
    else {
      bAR[3] = bF1;
      CurLevel._8_8_ = (ulong)bF1 & 0xfffffffffffffffe;
      bAR[0] = (DdNode *)((ulong)bF2 & 0xfffffffffffffffe);
      bAR[1] = (DdNode *)((ulong)bC1 & 0xfffffffffffffffe);
      bAR[2] = (DdNode *)((ulong)bC2 & 0xfffffffffffffffe);
      if (*(uint *)CurLevel._8_8_ == 0x7fffffff) {
        local_10c = *(uint *)CurLevel._8_8_;
      }
      else {
        local_10c = dd->perm[*(uint *)CurLevel._8_8_];
      }
      i = local_10c;
      if (bAR[0]->index == 0x7fffffff) {
        local_11c = bAR[0]->index;
      }
      else {
        local_11c = dd->perm[bAR[0]->index];
      }
      TopLevel = local_11c;
      if (bAR[1]->index == 0x7fffffff) {
        local_12c = bAR[1]->index;
      }
      else {
        local_12c = dd->perm[bAR[1]->index];
      }
      CurLevel[0] = local_12c;
      if (bAR[2]->index == 0x7fffffff) {
        local_13c = bAR[2]->index;
      }
      else {
        local_13c = dd->perm[bAR[2]->index];
      }
      CurLevel[1] = local_13c;
      local_9c = 0x7fffffff;
      pCache->nFailure = pCache->nFailure + 1;
      for (local_a0 = 0; local_a0 < 4; local_a0 = local_a0 + 1) {
        if ((&i)[local_a0] < local_9c) {
          local_9c = (&i)[local_a0];
        }
      }
      for (local_a0 = 0; local_a0 < 4; local_a0 = local_a0 + 1) {
        if (local_9c == (&i)[local_a0]) {
          if (bAR[(long)local_a0 + 3] == bAR[(long)local_a0 + -1]) {
            bT[(long)local_a0 + 3] = (bAR[(long)local_a0 + -1]->type).kids.E;
            bT[(long)local_a0 + -1] = (DdNode *)(bAR[(long)local_a0 + -1]->type).value;
          }
          else {
            bT[(long)local_a0 + 3] = (DdNode *)((ulong)(bAR[(long)local_a0 + -1]->type).kids.E ^ 1);
            bT[(long)local_a0 + -1] = (DdNode *)((ulong)(bAR[(long)local_a0 + -1]->type).kids.T ^ 1)
            ;
          }
        }
        else {
          pDVar1 = bAR[(long)local_a0 + 3];
          bT[(long)local_a0 + -1] = pDVar1;
          bT[(long)local_a0 + 3] = pDVar1;
        }
      }
      if ((local_9c == CurLevel[0]) && (local_9c == CurLevel[1])) {
        if (bE[1] == (DdNode *)((ulong)dd->one ^ 1)) {
          bF2next = bF1next;
          bC2next = bT[1];
        }
        else {
          bF2next = bT[3];
          bC2next = bE[1];
        }
        if (bE[2] == (DdNode *)((ulong)dd->one ^ 1)) {
          bC1next = bT[0];
          local_108 = bT[2];
        }
        else {
          bC1next = bE[0];
          local_108 = bE[2];
        }
        local_40 = Dsd_CheckRootFunctionIdentity_rec(dd,bF2next,bC1next,bC2next,local_108);
      }
      else if ((local_9c == CurLevel[0]) && (local_9c != CurLevel[1])) {
        if (bE[1] == (DdNode *)((ulong)dd->one ^ 1)) {
          bF2next = bF1next;
          bC2next = bT[1];
        }
        else {
          bF2next = bT[3];
          bC2next = bE[1];
        }
        local_40 = Dsd_CheckRootFunctionIdentity_rec(dd,bF2next,bE[0],bC2next,bE[2]);
        if (local_40 == 1) {
          local_40 = Dsd_CheckRootFunctionIdentity_rec(dd,bF2next,bT[0],bC2next,bT[2]);
        }
      }
      else if ((local_9c == CurLevel[0]) || (local_9c != CurLevel[1])) {
        local_40 = Dsd_CheckRootFunctionIdentity_rec(dd,bT[3],bE[0],bE[1],bE[2]);
        if (local_40 == 1) {
          local_40 = Dsd_CheckRootFunctionIdentity_rec(dd,bF1next,bT[0],bT[1],bT[2]);
        }
      }
      else {
        if (bE[2] == (DdNode *)((ulong)dd->one ^ 1)) {
          bC1next = bT[0];
          local_108 = bT[2];
        }
        else {
          bC1next = bE[0];
          local_108 = bE[2];
        }
        local_40 = Dsd_CheckRootFunctionIdentity_rec(dd,bT[3],bC1next,bE[1],local_108);
        if (local_40 == 1) {
          local_40 = Dsd_CheckRootFunctionIdentity_rec(dd,bF1next,bC1next,bT[1],local_108);
        }
      }
      for (local_a0 = 0; local_a0 < 4; local_a0 = local_a0 + 1) {
        pCache->pTable[uVar2 & 0xffffffff].bX[local_a0] = bAR[(long)local_a0 + 3];
      }
      pCache->pTable[uVar2 & 0xffffffff].bX[4] = (DdNode *)(long)(int)local_40;
      dd_local._4_4_ = local_40;
    }
  }
  return dd_local._4_4_;
}

Assistant:

int Dsd_CheckRootFunctionIdentity_rec( DdManager * dd, DdNode * bF1, DdNode * bF2, DdNode * bC1, DdNode * bC2 )
{
    unsigned HKey;

    // if either bC1 or bC2 is zero, the test is true
//  if ( bC1 == b0 || bC2 == b0 )  return 1;
    assert( bC1 != b0 );
    assert( bC2 != b0 );

    // if both bC1 and bC2 are one - perform comparison
    if ( bC1 == b1 && bC2 == b1 )  return (int)( bF1 == bF2 );

    if ( bF1 == b0 )
        return Cudd_bddLeq( dd, bC2, Cudd_Not(bF2) );

    if ( bF1 == b1 )
        return Cudd_bddLeq( dd, bC2, bF2 );

    if ( bF2 == b0 )
        return Cudd_bddLeq( dd, bC1, Cudd_Not(bF1) );

    if ( bF2 == b1 )
        return Cudd_bddLeq( dd, bC1, bF1 );

    // otherwise, keep expanding

    // check cache
//  HKey = _Hash( ((unsigned)bF1), ((unsigned)bF2), ((unsigned)bC1), ((unsigned)bC2) );
    HKey = hashKey4( bF1, bF2, bC1, bC2, pCache->nTableSize );
    if ( pCache->pTable[HKey].bX[0] == bF1 && 
         pCache->pTable[HKey].bX[1] == bF2 && 
         pCache->pTable[HKey].bX[2] == bC1 && 
         pCache->pTable[HKey].bX[3] == bC2 )
    {
        pCache->nSuccess++;
        return (int)(ABC_PTRUINT_T)pCache->pTable[HKey].bX[4]; // the last bit records the result (yes/no)
    }
    else
    {

        // determine the top variables
        int RetValue;
        DdNode * bA[4]  = { bF1, bF2, bC1, bC2 }; // arguments
        DdNode * bAR[4] = { Cudd_Regular(bF1), Cudd_Regular(bF2), Cudd_Regular(bC1), Cudd_Regular(bC2) }; // regular arguments
        int CurLevel[4] = { cuddI(dd,bAR[0]->index), cuddI(dd,bAR[1]->index), cuddI(dd,bAR[2]->index), cuddI(dd,bAR[3]->index) };
        int TopLevel = CUDD_CONST_INDEX;
        int i;
        DdNode * bE[4], * bT[4];
        DdNode * bF1next, * bF2next, * bC1next, * bC2next;

        pCache->nFailure++;

        // determine the top level
        for ( i = 0; i < 4; i++ )
            if ( TopLevel > CurLevel[i] )
                 TopLevel = CurLevel[i];

        // compute the cofactors
        for ( i = 0; i < 4; i++ )
        if ( TopLevel == CurLevel[i] )
        {
            if ( bA[i] != bAR[i] ) // complemented
            {
                bE[i] = Cudd_Not(cuddE(bAR[i]));
                bT[i] = Cudd_Not(cuddT(bAR[i]));
            }
            else
            {
                bE[i] = cuddE(bAR[i]);
                bT[i] = cuddT(bAR[i]);
            }
        }
        else
            bE[i] = bT[i] = bA[i];

        // solve subproblems
        // three cases are possible

        // (1) the top var belongs to both C1 and C2
        //     in this case, any cofactor of F1 and F2 will do, 
        //     as long as the corresponding cofactor of C1 and C2 is not equal to 0
        if ( TopLevel == CurLevel[2] && TopLevel == CurLevel[3] ) 
        {
            if ( bE[2] != b0 ) // C1
            {
                bF1next = bE[0];
                bC1next = bE[2];
            }
            else
            {
                bF1next = bT[0];
                bC1next = bT[2];
            }
            if ( bE[3] != b0 ) // C2
            {
                bF2next = bE[1];
                bC2next = bE[3];
            }
            else
            {
                bF2next = bT[1];
                bC2next = bT[3];
            }
            RetValue = Dsd_CheckRootFunctionIdentity_rec( dd, bF1next, bF2next, bC1next, bC2next );
        }
        // (2) the top var belongs to either C1 or C2
        //     in this case normal splitting of cofactors
        else if ( TopLevel == CurLevel[2] && TopLevel != CurLevel[3] ) 
        {
            if ( bE[2] != b0 ) // C1
            {
                bF1next = bE[0];
                bC1next = bE[2];
            }
            else
            {
                bF1next = bT[0];
                bC1next = bT[2];
            }
            // split around this variable
            RetValue = Dsd_CheckRootFunctionIdentity_rec( dd, bF1next, bE[1], bC1next, bE[3] );
            if ( RetValue == 1 ) // test another branch; otherwise, there is no need to test
                RetValue = Dsd_CheckRootFunctionIdentity_rec( dd, bF1next, bT[1], bC1next, bT[3] );
        }
        else if ( TopLevel != CurLevel[2] && TopLevel == CurLevel[3] ) 
        {
            if ( bE[3] != b0 ) // C2
            {
                bF2next = bE[1];
                bC2next = bE[3];
            }
            else
            {
                bF2next = bT[1];
                bC2next = bT[3];
            }
            // split around this variable
            RetValue = Dsd_CheckRootFunctionIdentity_rec( dd, bE[0], bF2next, bE[2], bC2next );
            if ( RetValue == 1 ) // test another branch; otherwise, there is no need to test
                RetValue = Dsd_CheckRootFunctionIdentity_rec( dd, bT[0], bF2next, bT[2], bC2next );
        }
        // (3) the top var does not belong to C1 and C2
        //     in this case normal splitting of cofactors
        else // if ( TopLevel != CurLevel[2] && TopLevel != CurLevel[3] )
        {
            // split around this variable
            RetValue = Dsd_CheckRootFunctionIdentity_rec( dd, bE[0], bE[1], bE[2], bE[3] );
            if ( RetValue == 1 ) // test another branch; otherwise, there is no need to test
                RetValue = Dsd_CheckRootFunctionIdentity_rec( dd, bT[0], bT[1], bT[2], bT[3] );
        }

        // set cache
        for ( i = 0; i < 4; i++ )
            pCache->pTable[HKey].bX[i] = bA[i];
        pCache->pTable[HKey].bX[4] = (DdNode*)(ABC_PTRUINT_T)RetValue;

        return RetValue;
    }
}